

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_quantize_intrin_avx2.c
# Opt level: O3

void aom_highbd_quantize_b_32x32_avx2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 local_60 [32];
  
  auVar11 = *(undefined1 (*) [16])zbin_ptr;
  auVar1 = *(undefined1 (*) [16])round_ptr;
  auVar2 = *(undefined1 (*) [16])quant_ptr;
  auVar3 = *(undefined1 (*) [16])dequant_ptr;
  auVar4 = *(undefined1 (*) [16])quant_shift_ptr;
  auVar15 = vpsraw_avx(auVar11,0xf);
  auVar5 = vpunpcklwd_avx(auVar11,auVar15);
  auVar11 = vpunpckhwd_avx(auVar11,auVar15);
  auVar16._0_16_ = ZEXT116(0) * auVar11 + ZEXT116(1) * auVar5;
  auVar16._16_16_ = ZEXT116(1) * auVar11;
  auVar11 = vpsraw_avx(auVar1,0xf);
  auVar5 = vpunpcklwd_avx(auVar1,auVar11);
  auVar11 = vpunpckhwd_avx(auVar1,auVar11);
  auVar13._0_16_ = ZEXT116(0) * auVar11 + ZEXT116(1) * auVar5;
  auVar13._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar11;
  auVar11 = vpsraw_avx(auVar2,0xf);
  auVar1 = vpunpcklwd_avx(auVar2,auVar11);
  auVar11 = vpunpckhwd_avx(auVar2,auVar11);
  local_a0._0_16_ = ZEXT116(0) * auVar11 + ZEXT116(1) * auVar1;
  local_a0._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar11;
  auVar11 = vpsraw_avx(auVar3,0xf);
  auVar1 = vpunpcklwd_avx(auVar3,auVar11);
  auVar11 = vpunpckhwd_avx(auVar3,auVar11);
  local_80._0_16_ = ZEXT116(0) * auVar11 + ZEXT116(1) * auVar1;
  local_80._16_16_ = ZEXT116(1) * auVar11;
  auVar11 = vpsraw_avx(auVar4,0xf);
  auVar1 = vpunpcklwd_avx(auVar4,auVar11);
  auVar11 = vpunpckhwd_avx(auVar4,auVar11);
  local_60._0_16_ = ZEXT116(0) * auVar11 + ZEXT116(1) * auVar1;
  local_60._16_16_ = ZEXT116(1) * auVar11;
  auVar14 = vpcmpeqd_avx2(in_ZMM7._0_32_,in_ZMM7._0_32_);
  auVar16 = vpsubd_avx2(auVar16,auVar14);
  auVar18 = vpsrad_avx2(auVar16,1);
  auVar16 = vpsubd_avx2(auVar13,auVar14);
  local_c0 = vpsrad_avx2(auVar16,1);
  local_e0 = vpaddd_avx2(auVar18,auVar14);
  auVar16 = *(undefined1 (*) [32])coeff_ptr;
  auVar13 = vpabsd_avx2(auVar16);
  auVar18 = vpcmpgtd_avx2(auVar18,auVar13);
  auVar14 = auVar14 & ~auVar18;
  if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar14 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar14 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar14 >> 0x7f,0) == '\0') &&
        (auVar14 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar14 >> 0xbf,0) == '\0') &&
      (auVar14 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar14[0x1f]) {
    auVar12 = ZEXT1664((undefined1  [16])0x0);
    *(undefined1 (*) [32])qcoeff_ptr = auVar12._0_32_;
    *(undefined1 (*) [32])dqcoeff_ptr = auVar12._0_32_;
  }
  else {
    auVar14 = vpaddd_avx2(local_c0,auVar13);
    auVar14 = vpandn_avx2(auVar18,auVar14);
    auVar13 = vpmuldq_avx2(auVar14,local_a0);
    auVar17 = vpsrlq_avx2(auVar14,0x20);
    auVar18 = vpsrlq_avx2(local_a0,0x20);
    auVar18 = vpmuldq_avx2(auVar17,auVar18);
    auVar17 = vpsrlq_avx2(auVar13,0x10);
    auVar13 = vpsllq_avx2(auVar18,0x10);
    auVar13 = vpblendd_avx2(auVar17,auVar13,0xaa);
    auVar14 = vpaddd_avx2(auVar14,auVar13);
    auVar13 = vpmuldq_avx2(auVar14,local_60);
    auVar14 = vpsrlq_avx2(auVar14,0x20);
    auVar18 = vpsrlq_avx2(local_60,0x20);
    auVar14 = vpmuldq_avx2(auVar14,auVar18);
    auVar13 = vpsrlq_avx2(auVar13,0xf);
    auVar14 = vpsllq_avx2(auVar14,0x11);
    auVar13 = vpblendd_avx2(auVar13,auVar14,0xaa);
    auVar14 = vpmulld_avx2(local_80,auVar13);
    auVar18 = vpsrld_avx2(auVar14,1);
    auVar14 = vpcmpgtd_avx2(auVar13,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    auVar13 = vpsignd_avx2(auVar13,auVar16);
    auVar16 = vpsignd_avx2(auVar18,auVar16);
    *(undefined1 (*) [32])qcoeff_ptr = auVar13;
    *(undefined1 (*) [32])dqcoeff_ptr = auVar16;
    auVar16 = vpackssdw_avx2(auVar14,auVar14);
    auVar18._0_16_ = ZEXT116(1) * *(undefined1 (*) [16])iscan + ZEXT116(0) * auVar16._0_16_;
    auVar18._16_16_ = ZEXT116(1) * auVar16._16_16_ + ZEXT116(0) * *(undefined1 (*) [16])iscan;
    auVar14 = vpermq_avx2(auVar16,0xd8);
    auVar16 = vpsubw_avx2(auVar18,auVar14);
    auVar16 = vpand_avx2(auVar16,auVar14);
    auVar16 = vpmaxsw_avx2(auVar16,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    auVar12 = ZEXT3264(auVar16);
  }
  auVar11 = auVar12._0_16_;
  lVar9 = 0;
  do {
    uVar7 = *(undefined8 *)(local_c0 + lVar9);
    uVar8 = *(undefined8 *)(local_c0 + lVar9 + 8);
    *(undefined8 *)(local_e0 + lVar9) = uVar7;
    *(undefined8 *)(local_e0 + lVar9 + 8) = uVar8;
    *(undefined8 *)(local_e0 + lVar9 + 0x10) = uVar7;
    *(undefined8 *)(local_e0 + lVar9 + 0x18) = uVar8;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0xa0);
  if (8 < n_coeffs) {
    auVar14 = vpsrad_avx2(local_a0,0x1f);
    auVar16 = vpshufd_avx2(local_a0,0xf5);
    auVar14 = vpblendd_avx2(auVar16,auVar14,0xaa);
    auVar13 = vpsrad_avx2(local_60,0x1f);
    auVar16 = vpshufd_avx2(local_60,0xf5);
    auVar16 = vpblendd_avx2(auVar16,auVar13,0xaa);
    uVar10 = n_coeffs + 8;
    lVar9 = 0x10;
    auVar13 = vpsrlq_avx2(auVar14,0x20);
    do {
      auVar18 = *(undefined1 (*) [32])((long)coeff_ptr + lVar9 * 2);
      auVar17 = vpabsd_avx2(auVar18);
      auVar21 = vpcmpgtd_avx2(auVar17,local_e0);
      auVar19 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar21 >> 0x7f,0) == '\0') &&
            (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar21 >> 0xbf,0) == '\0') &&
          (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar21[0x1f])
      {
        *(undefined1 (*) [32])((long)qcoeff_ptr + lVar9 * 2) = auVar19;
        *(undefined1 (*) [32])((long)dqcoeff_ptr + lVar9 * 2) = auVar19;
      }
      else {
        auVar17 = vpaddd_avx2(auVar17,local_c0);
        auVar21 = vpand_avx2(auVar21,auVar17);
        auVar20 = vpmuldq_avx2(auVar21,local_a0);
        auVar22 = vpsrad_avx2(auVar21,0x1f);
        auVar6 = vpshufd_avx2(auVar21,0xf5);
        auVar17 = vpmuludq_avx2(auVar6,auVar13);
        auVar22 = vpsrlq_avx2(auVar22,0x20);
        auVar22 = vpmuludq_avx2(auVar22,auVar14);
        auVar17 = vpaddq_avx2(auVar17,auVar22);
        auVar22 = vpsllq_avx2(auVar17,0x20);
        auVar17 = vpmuludq_avx2(auVar6,auVar14);
        auVar17 = vpaddq_avx2(auVar17,auVar22);
        auVar20 = vpsrlq_avx2(auVar20,0x10);
        auVar17 = vpsllq_avx2(auVar17,0x10);
        auVar17 = vpblendd_avx2(auVar20,auVar17,0xaa);
        auVar17 = vpaddd_avx2(auVar21,auVar17);
        auVar21 = vpmuldq_avx2(auVar17,local_60);
        auVar20 = vpsrad_avx2(auVar17,0x1f);
        auVar22 = vpshufd_avx2(auVar17,0xf5);
        auVar17 = vpsrlq_avx2(auVar16,0x20);
        auVar17 = vpmuludq_avx2(auVar22,auVar17);
        auVar20 = vpsrlq_avx2(auVar20,0x20);
        auVar20 = vpmuludq_avx2(auVar20,auVar16);
        auVar17 = vpaddq_avx2(auVar17,auVar20);
        auVar20 = vpsllq_avx2(auVar17,0x20);
        auVar17 = vpmuludq_avx2(auVar22,auVar16);
        auVar17 = vpaddq_avx2(auVar17,auVar20);
        auVar21 = vpsrlq_avx2(auVar21,0xf);
        auVar17 = vpsllq_avx2(auVar17,0x11);
        auVar21 = vpblendd_avx2(auVar21,auVar17,0xaa);
        auVar17 = vpmulld_avx2(local_80,auVar21);
        auVar20 = vpsrld_avx2(auVar17,1);
        auVar17 = vpcmpgtd_avx2(auVar21,auVar19);
        auVar21 = vpsignd_avx2(auVar21,auVar18);
        auVar18 = vpsignd_avx2(auVar20,auVar18);
        *(undefined1 (*) [32])((long)qcoeff_ptr + lVar9 * 2) = auVar21;
        *(undefined1 (*) [32])((long)dqcoeff_ptr + lVar9 * 2) = auVar18;
        auVar18 = vpackssdw_avx2(auVar17,auVar17);
        auVar21._0_16_ =
             ZEXT116(0) * auVar12._0_16_ + ZEXT116(1) * *(undefined1 (*) [16])((long)iscan + lVar9);
        auVar21._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar12._0_16_;
        auVar17 = vpermq_avx2(auVar18,0xd8);
        auVar18 = vpsubw_avx2(auVar21,auVar17);
        auVar18 = vpand_avx2(auVar18,auVar17);
        auVar18 = vpmaxsw_avx2(auVar18,auVar12._0_32_);
        auVar12 = ZEXT3264(auVar18);
      }
      auVar11 = auVar12._0_16_;
      lVar9 = lVar9 + 0x10;
      uVar10 = uVar10 - 8;
    } while (0x10 < uVar10);
  }
  auVar1 = vpshufd_avx(auVar11,0xe);
  auVar11 = vpmaxsw_avx(auVar11,auVar1);
  auVar1 = vpshuflw_avx(auVar11,0xe);
  auVar11 = vpmaxsw_avx(auVar11,auVar1);
  auVar1 = vpshuflw_avx(auVar11,1);
  auVar11 = vpmaxsw_avx(auVar11,auVar1);
  vpextrw_avx(auVar11,0);
  return;
}

Assistant:

void aom_highbd_quantize_b_32x32_avx2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan) {
  (void)scan;
  const unsigned int step = 8;

  __m256i eob = _mm256_setzero_si256();
  __m256i qp[5];
  init_qp(zbin_ptr, round_ptr, quant_ptr, dequant_ptr, quant_shift_ptr, qp, 1);

  quantize_logscale(qp, coeff_ptr, iscan, qcoeff_ptr, dqcoeff_ptr, &eob, 1);

  coeff_ptr += step;
  qcoeff_ptr += step;
  dqcoeff_ptr += step;
  iscan += step;
  n_coeffs -= step;

  update_qp(qp);

  while (n_coeffs > 0) {
    quantize_logscale(qp, coeff_ptr, iscan, qcoeff_ptr, dqcoeff_ptr, &eob, 1);

    coeff_ptr += step;
    qcoeff_ptr += step;
    dqcoeff_ptr += step;
    iscan += step;
    n_coeffs -= step;
  }

  *eob_ptr = get_max_eob(eob);
}